

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O1

void __thiscall capnp::LocalCallContext::~LocalCallContext(LocalCallContext *this)

{
  PromiseFulfiller<capnp::AnyPointer::Pipeline> **this_00;
  
  this_00 = &this[-1].tailCallPipelineFulfiller.ptr.ptr;
  ~LocalCallContext((LocalCallContext *)this_00);
  operator_delete(this_00,0xa8);
  return;
}

Assistant:

class LocalCallContext final: public CallContextHook, public ResponseHook, public kj::Refcounted {
public:
  LocalCallContext(kj::Own<MallocMessageBuilder>&& request, kj::Own<ClientHook> clientRef,
                   ClientHook::CallHints hints, bool isStreaming)
      : request(kj::mv(request)), clientRef(kj::mv(clientRef)), hints(hints),
        isStreaming(isStreaming) {}

  AnyPointer::Reader getParams() override {
    KJ_IF_SOME(r, request) {
      return r.get()->getRoot<AnyPointer>();
    } else {
      KJ_FAIL_REQUIRE("Can't call getParams() after releaseParams().");
    }
  }
  void releaseParams() override {
    request = kj::none;
  }